

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O1

void __thiscall DThinker::DThinker(DThinker *this,int statnum)

{
  byte *pbVar1;
  ulong uVar2;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f8ca8;
  this->NextThinker = (DThinker *)0x0;
  this->PrevThinker = (DThinker *)0x0;
  if (bSerialOverride == false) {
    pbVar1 = (byte *)((long)&(this->super_DObject).ObjectFlags + 1);
    *pbVar1 = *pbVar1 | 1;
    uVar2 = 0x7f;
    if ((uint)statnum < 0x7f) {
      uVar2 = (ulong)(uint)statnum;
    }
    FThinkerList::AddTail(FreshThinkers + uVar2,this);
  }
  return;
}

Assistant:

DThinker::DThinker (int statnum) throw()
{
	NextThinker = NULL;
	PrevThinker = NULL;
	if (bSerialOverride)
	{ // The serializer will insert us into the right list
		return;
	}

	ObjectFlags |= OF_JustSpawned;
	if ((unsigned)statnum > MAX_STATNUM)
	{
		statnum = MAX_STATNUM;
	}
	FreshThinkers[statnum].AddTail (this);
}